

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
findOrInsert<void_const*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *this,void **key)

{
  Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *this_00;
  long lVar1;
  void *pvVar2;
  long lVar3;
  InsertionResult *pIVar4;
  ulong uVar5;
  Span *key_00;
  Node<const_void_*,_(anonymous_namespace)::Data> *pNVar6;
  ulong uVar7;
  long lVar8;
  void **key_01;
  size_t index;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *this_01;
  long lVar12;
  Bucket BVar13;
  R_conflict2 RVar14;
  
  this_00 = *(Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> **)(this + 0x10);
  if (this_00 == (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)0x0) {
    BVar13 = (Bucket)ZEXT816(0);
  }
  else {
    key_01 = *(void ***)(this + 0x20);
    BVar13 = findBucketWithHash<void_const*>(this_00,key_01,(size_t)*key);
    pIVar4 = (InsertionResult *)CONCAT71(BVar13.span._1_7_,1);
    if ((BVar13.span)->offsets[BVar13.index] != 0xff) goto LAB_00387ab7;
  }
  uVar7 = *(ulong *)(this + 8);
  if ((ulong)this_00 >> 1 <= uVar7) {
    uVar5 = uVar7 + 1;
    if (uVar7 + 1 == 0) {
      uVar5 = uVar7;
    }
    this_01 = (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)0x80;
    if ((0x40 < uVar5) &&
       (this_01 = (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)
                  0xffffffffffffffff, uVar5 >> 0x3e == 0)) {
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      this_01 = (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)
                (1L << (0x41 - ((byte)lVar3 ^ 0x3f) & 0x3f));
    }
    lVar3 = *(long *)(this + 0x20);
    RVar14 = Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::allocateSpans
                       ((size_t)this_01);
    key_00 = RVar14.spans;
    *(Span **)(this + 0x20) = key_00;
    *(Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> **)(this + 0x10) = this_01;
    if (this_00 < (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)0x80) {
      if (lVar3 != 0) goto LAB_00387a2a;
    }
    else {
      uVar7 = 0;
      lVar12 = lVar3;
      do {
        lVar11 = uVar7 * 0x90 + lVar3;
        lVar10 = 0;
        do {
          if (*(byte *)(lVar12 + lVar10) != 0xff) {
            lVar1 = *(long *)(lVar11 + 0x80);
            lVar8 = (ulong)*(byte *)(lVar12 + lVar10) * 0x10;
            BVar13 = findBucketWithHash<void_const*>
                               (*(Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>
                                  **)(this + 0x10),*(void ***)(this + 0x20),
                                *(size_t *)(lVar1 + lVar8));
            pNVar6 = Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::
                     insert((Bucket *)BVar13.span);
            puVar9 = (undefined8 *)(lVar1 + lVar8);
            pvVar2 = (void *)puVar9[1];
            pNVar6->key = (void *)*puVar9;
            (pNVar6->value).pointer = pvVar2;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x80);
        if (*(void **)(lVar11 + 0x80) != (void *)0x0) {
          operator_delete__(*(void **)(lVar11 + 0x80));
          *(undefined8 *)(lVar11 + 0x80) = 0;
        }
        uVar7 = uVar7 + 1;
        lVar12 = lVar12 + 0x90;
      } while (uVar7 != (ulong)this_00 >> 7);
LAB_00387a2a:
      lVar12 = *(long *)(lVar3 + -8);
      if (lVar12 != 0) {
        lVar10 = lVar12 * 0x90;
        do {
          pvVar2 = *(void **)(lVar3 + -0x10 + lVar10);
          if (pvVar2 != (void *)0x0) {
            operator_delete__(pvVar2);
            *(undefined8 *)(lVar3 + -0x10 + lVar10) = 0;
          }
          lVar10 = lVar10 + -0x90;
        } while (lVar10 != 0);
      }
      operator_delete__((void *)(lVar3 + -8),lVar12 * 0x90 + 8);
      this_01 = *(Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> **)(this + 0x10)
      ;
      key_00 = *(Span **)(this + 0x20);
    }
    BVar13 = findBucketWithHash<void_const*>(this_01,(void **)key_00,(size_t)*key);
  }
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert
            ((Bucket *)BVar13.span);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  key_01 = *(void ***)(this + 0x20);
  pIVar4 = (InsertionResult *)0x0;
LAB_00387ab7:
  (__return_storage_ptr__->it).d =
       (Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar13.span - (long)key_01) >> 4) * 0x1c71c71c71c71c80 | BVar13.index;
  __return_storage_ptr__->initialized = SUB81(pIVar4,0);
  return pIVar4;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }